

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

idx_t __thiscall duckdb::ColumnReader::FileOffset(ColumnReader *this)

{
  runtime_error *this_00;
  unsigned_long uVar1;
  long in_RDI;
  unsigned_long min_offset;
  unsigned_long local_20;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FileOffset called on ColumnReader with no chunk");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20 = NumericLimits<unsigned_long>::Maximum();
  if ((*(byte *)(*(long *)(in_RDI + 0x28) + 0x1d0) >> 2 & 1) != 0) {
    local_20 = MinValue<unsigned_long>(local_20,*(unsigned_long *)(*(long *)(in_RDI + 0x28) + 0xb8))
    ;
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x28) + 0x1d0) >> 1 & 1) != 0) {
    local_20 = MinValue<unsigned_long>(local_20,*(unsigned_long *)(*(long *)(in_RDI + 0x28) + 0xb0))
    ;
  }
  uVar1 = MinValue<unsigned_long>(local_20,*(unsigned_long *)(*(long *)(in_RDI + 0x28) + 0xa8));
  return uVar1;
}

Assistant:

idx_t ColumnReader::FileOffset() const {
	if (!chunk) {
		throw std::runtime_error("FileOffset called on ColumnReader with no chunk");
	}
	auto min_offset = NumericLimits<idx_t>::Maximum();
	if (chunk->meta_data.__isset.dictionary_page_offset) {
		min_offset = MinValue<idx_t>(min_offset, chunk->meta_data.dictionary_page_offset);
	}
	if (chunk->meta_data.__isset.index_page_offset) {
		min_offset = MinValue<idx_t>(min_offset, chunk->meta_data.index_page_offset);
	}
	min_offset = MinValue<idx_t>(min_offset, chunk->meta_data.data_page_offset);

	return min_offset;
}